

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_open_output_string_op(sexp ctx,sexp self,sexp_sint_t n)

{
  sexp psVar1;
  sexp psVar2;
  sexp_sint_t n_00;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_20;
  sexp_gc_var_t local_18;
  
  local_18.var = &local_20;
  local_20 = (sexp)0x43e;
  local_18.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_18;
  psVar2 = (sexp)0x0;
  local_20 = sexp_make_input_port(ctx,(FILE *)0x0,(sexp)&DAT_0000003e);
  if ((((ulong)local_20 & 3) != 0) || (local_20->tag != 0x13)) {
    local_20->tag = 0x11;
  }
  if ((((ulong)local_20 & 3) != 0) || (psVar1 = local_20, local_20->tag != 0x13)) {
    psVar2 = sexp_cons_op(ctx,psVar2,n_00,(sexp)&DAT_0000003e,(sexp)&DAT_0000023e);
    (local_20->value).type.cpl = psVar2;
    psVar2 = (sexp)sexp_alloc(ctx,0x1011);
    if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
      psVar2->tag = 8;
      (psVar2->value).flonum = 2.02369288536575e-320;
      (psVar2->value).flonum_bits[0x1008] = '\0';
    }
    (((local_20->value).type.cpl)->value).type.name = psVar2;
    psVar1 = (((local_20->value).type.cpl)->value).type.name;
    if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
      (local_20->value).type.setters = (sexp)((long)&psVar1->value + 8);
      (local_20->value).port.size = 0x1000;
      (local_20->value).type.print = (sexp)0x0;
      (local_20->value).flonum_bits[0x2a] = '\0';
      psVar1 = local_20;
    }
  }
  local_20 = psVar1;
  (ctx->value).context.saves = local_18.next;
  return local_20;
}

Assistant:

sexp sexp_open_output_string_op (sexp ctx, sexp self, sexp_sint_t n) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_output_port(ctx, NULL, SEXP_FALSE);
  if (!sexp_exceptionp(res)) {
    sexp_port_cookie(res) = sexp_cons(ctx, SEXP_FALSE, SEXP_NULL);
    sexp_car(sexp_port_cookie(res)) =
      sexp_make_bytes(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
    if (sexp_exceptionp(sexp_car(sexp_port_cookie(res)))) {
      res = sexp_car(sexp_port_cookie(res));
    } else {
      sexp_port_buf(res) = sexp_bytes_data(sexp_car(sexp_port_cookie(res)));
      sexp_port_size(res) = SEXP_PORT_BUFFER_SIZE;
      sexp_port_offset(res) = 0;
      sexp_port_binaryp(res) = 0;
    }
  }
  sexp_gc_release1(ctx);
  return res;
}